

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlStringGetNodeList(xmlDoc *doc,xmlChar *value)

{
  byte bVar1;
  xmlChar xVar2;
  int iVar3;
  xmlBufPtr buf;
  xmlEntityPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr pxVar7;
  _xmlNode *p_Var8;
  xmlNodePtr pxVar9;
  xmlChar *pxVar10;
  long lVar11;
  xmlChar *pxVar12;
  xmlChar buffer [10];
  xmlNodePtr local_50;
  xmlChar local_3a [10];
  
  if (value == (xmlChar *)0x0) {
    pxVar5 = (xmlNodePtr)0x0;
  }
  else {
    pxVar5 = (xmlNodePtr)0x0;
    buf = xmlBufCreateSize(0);
    if (buf != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
      local_50 = (xmlNodePtr)0x0;
      pxVar7 = (xmlNodePtr)0x0;
LAB_00182199:
      do {
        pxVar10 = value + 2;
        pxVar12 = value;
        while( true ) {
          if (*pxVar12 == '\0') {
            if ((pxVar12 != value) || (pxVar7 == (xmlNodePtr)0x0)) {
              xmlBufAdd(buf,value,(int)pxVar12 - (int)value);
            }
            iVar3 = xmlBufIsEmpty(buf);
            if (iVar3 == 0) {
              pxVar5 = xmlNewText((xmlChar *)0x0);
              if (pxVar5 == (xmlNodePtr)0x0) goto LAB_001824e0;
              pxVar5->doc = doc;
              pxVar10 = xmlBufDetach(buf);
              pxVar5->content = pxVar10;
              if (local_50 == (xmlNodePtr)0x0) {
                pxVar7 = (xmlNodePtr)0x0;
                goto LAB_001824e6;
              }
              xmlAddNextSibling(local_50,pxVar5);
            }
            pxVar5 = pxVar7;
            pxVar7 = (xmlNodePtr)0x0;
            goto LAB_001824e6;
          }
          if (*pxVar12 == '&') break;
          pxVar12 = pxVar12 + 1;
          pxVar10 = pxVar10 + 1;
        }
        if ((pxVar12 != value) &&
           (iVar3 = xmlBufAdd(buf,value,(int)pxVar12 - (int)value), iVar3 != 0)) break;
        xVar2 = pxVar12[1];
        if (xVar2 != '#') {
          lVar11 = 0;
          value = pxVar10;
          while( true ) {
            if (xVar2 == '\0') {
              __xmlSimpleError(2,0x516,(xmlNodePtr)doc,"unterminated entity reference %15s\n",
                               (char *)(pxVar12 + 1));
              goto LAB_001824e0;
            }
            if (xVar2 == ';') break;
            xVar2 = *value;
            value = value + 1;
            lVar11 = lVar11 + 1;
          }
          if (lVar11 == 0) goto LAB_00182199;
          pxVar10 = xmlStrndup(pxVar12 + 1,(int)lVar11);
          pxVar4 = xmlGetDocEntity(doc,pxVar10);
          if ((pxVar4 == (xmlEntityPtr)0x0) || (pxVar4->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
            iVar3 = xmlBufIsEmpty(buf);
            pxVar5 = pxVar7;
            pxVar6 = local_50;
            if (iVar3 == 0) {
              pxVar5 = xmlNewText((xmlChar *)0x0);
              if (pxVar5 == (xmlNodePtr)0x0) goto LAB_00182518;
              pxVar5->doc = doc;
              pxVar12 = xmlBufDetach(buf);
              pxVar5->content = pxVar12;
              pxVar6 = pxVar5;
              if (local_50 != (xmlNodePtr)0x0) {
                pxVar6 = xmlAddNextSibling(local_50,pxVar5);
                pxVar5 = pxVar7;
              }
            }
            local_50 = pxVar6;
            pxVar6 = xmlNewReference(doc,pxVar10);
            pxVar7 = pxVar5;
            if (pxVar6 != (xmlNodePtr)0x0) {
              if ((pxVar4 != (xmlEntityPtr)0x0) && (pxVar4->children == (_xmlNode *)0x0)) {
                pxVar4->children = (_xmlNode *)0xffffffffffffffff;
                pxVar7 = xmlStringGetNodeList(doc,pxVar6->content);
                pxVar4->children = pxVar7;
                pxVar4->owner = 1;
                if (pxVar7 != (xmlNodePtr)0x0) {
                  do {
                    p_Var8 = pxVar7;
                    p_Var8->parent = (_xmlNode *)pxVar4;
                    pxVar7 = p_Var8->next;
                  } while (p_Var8->next != (_xmlNode *)0x0);
                  pxVar4->last = p_Var8;
                }
              }
              pxVar9 = pxVar6;
              if (local_50 != (xmlNodePtr)0x0) {
                pxVar9 = xmlAddNextSibling(local_50,pxVar6);
                pxVar6 = pxVar5;
              }
              goto LAB_00182443;
            }
          }
          else {
            iVar3 = xmlBufCat(buf,pxVar4->content);
            pxVar6 = pxVar7;
            pxVar9 = local_50;
            if (iVar3 == 0) {
LAB_00182443:
              local_50 = pxVar9;
              (*xmlFree)(pxVar10);
              pxVar7 = pxVar6;
              goto LAB_00182199;
            }
          }
LAB_00182518:
          xmlBufFree(buf);
          if (pxVar10 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar10);
          }
          pxVar5 = (xmlNodePtr)0x0;
          goto LAB_001824f4;
        }
        pxVar10 = pxVar12 + 2;
        bVar1 = pxVar12[2];
        lVar11 = 1;
        if (bVar1 == 0x3b) {
LAB_00182297:
          iVar3 = 0;
LAB_00182299:
          value = pxVar10 + lVar11;
        }
        else {
          if (bVar1 != 0x78) {
            iVar3 = 0;
            do {
              if (9 < (byte)(bVar1 - 0x30)) {
                lVar11 = 0;
                __xmlSimpleError(2,0x515,(xmlNodePtr)doc,"invalid decimal character value\n",
                                 (char *)0x0);
                goto LAB_00182297;
              }
              iVar3 = (uint)bVar1 + iVar3 * 10 + -0x30;
              bVar1 = pxVar10[1];
              pxVar10 = pxVar10 + 1;
            } while (bVar1 != 0x3b);
            goto LAB_00182299;
          }
          bVar1 = pxVar12[3];
          pxVar12 = pxVar12 + 3;
          iVar3 = 0;
          if (bVar1 != 0x3b) {
            iVar3 = 0;
            do {
              if ((byte)(bVar1 - 0x30) < 10) {
                iVar3 = iVar3 * 0x10 + (uint)bVar1 + -0x30;
              }
              else if ((byte)(bVar1 + 0x9f) < 6) {
                iVar3 = iVar3 * 0x10 + (uint)bVar1 + -0x57;
              }
              else {
                if (5 < (byte)(bVar1 + 0xbf)) {
                  lVar11 = 0;
                  __xmlSimpleError(2,0x514,(xmlNodePtr)doc,"invalid hexadecimal character value\n",
                                   (char *)0x0);
                  iVar3 = 0;
                  break;
                }
                iVar3 = iVar3 * 0x10 + (uint)bVar1 + -0x37;
              }
              bVar1 = pxVar12[1];
              pxVar12 = pxVar12 + 1;
            } while (bVar1 != 0x3b);
          }
          value = pxVar12 + lVar11;
        }
        if (iVar3 == 0) goto LAB_00182199;
        iVar3 = xmlCopyCharMultiByte(local_3a,iVar3);
        local_3a[iVar3] = '\0';
        iVar3 = xmlBufCat(buf,local_3a);
      } while (iVar3 == 0);
LAB_001824e0:
      pxVar5 = (xmlNodePtr)0x0;
LAB_001824e6:
      xmlBufFree(buf);
LAB_001824f4:
      if (pxVar7 != (xmlNodePtr)0x0) {
        xmlFreeNodeList(pxVar7);
      }
    }
  }
  return pxVar5;
}

Assistant:

xmlNodePtr
xmlStringGetNodeList(const xmlDoc *doc, const xmlChar *value) {
    xmlNodePtr ret = NULL, head = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val = NULL;
    const xmlChar *cur = value;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

    q = cur;
    while (*cur != 0) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loop */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if  (cur[1] == '#') {
		cur += 2;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loops */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((*cur != 0) && (*cur != ';')) cur++;
		if (*cur == 0) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY,
		               (xmlNodePtr) doc, (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
                            if (node == NULL)
                                goto out;
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = head = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL)
			    goto out;
			if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = head = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
                    val = NULL;
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int len;

		len = xmlCopyCharMultiByte(buffer, charval);
		buffer[len] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }
    if ((cur != q) || (head == NULL)) {
        /*
	 * Handle the last piece of text.
	 */
	xmlBufAdd(buf, q, cur - q);
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
        if (node == NULL)
            goto out;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    head = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    }

    ret = head;
    head = NULL;

out:
    xmlBufFree(buf);
    if (val != NULL) xmlFree(val);
    if (head != NULL) xmlFreeNodeList(head);
    return(ret);
}